

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMNodeImpl::replaceChild(DOMNodeImpl *this,DOMNode *param_1,DOMNode *param_2)

{
  DOMException *this_00;
  DOMDocument *pDVar1;
  MemoryManager *local_78;
  DOMDocumentImpl *local_68;
  DOMNode *local_58;
  MemoryManager *local_48;
  DOMNode *param_2_local;
  DOMNode *param_1_local;
  DOMNodeImpl *this_local;
  
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMNodeImpl *)0x0) {
    local_48 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar1 = getOwnerDocument(this);
    if (pDVar1 == (DOMDocument *)0x0) {
      local_58 = (DOMNode *)0x0;
    }
    else {
      local_58 = &pDVar1[-1].super_DOMNode;
    }
    if (local_58 == (DOMNode *)0x0) {
      local_78 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar1 = getOwnerDocument(this);
      if (pDVar1 == (DOMDocument *)0x0) {
        local_68 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_68 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
      }
      local_78 = DOMDocumentImpl::getMemoryManager(local_68);
    }
    local_48 = local_78;
  }
  DOMException::DOMException(this_00,3,0,local_48);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMNodeImpl::replaceChild(DOMNode *, DOMNode *)
{
    throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMNodeMemoryManager);
    return 0;
}